

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall ctemplate::BaseArena::Reset(BaseArena *this)

{
  int iVar1;
  int waste;
  int overage;
  BaseArena *this_local;
  
  FreeBlocks(this);
  this->freestart_ = this->first_blocks_[0].mem;
  this->remaining_ = this->first_blocks_[0].size;
  this->last_alloc_ = (char *)0x0;
  (this->status_).bytes_allocated_ = this->block_size_;
  if (((ulong)this->freestart_ & 7) != 0) {
    iVar1 = 8 - ((uint)this->freestart_ & 7);
    this->freestart_ = this->freestart_ + iVar1;
    this->remaining_ = this->remaining_ - (long)iVar1;
  }
  this->freestart_when_empty_ = this->freestart_;
  if (((ulong)this->freestart_ & 7) != 0) {
    __assert_fail("!(reinterpret_cast<uintptr_t>(freestart_)&(kDefaultAlignment-1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                  ,0xb2,"virtual void ctemplate::BaseArena::Reset()");
  }
  return;
}

Assistant:

void BaseArena::Reset() {
  FreeBlocks();
  freestart_ = first_blocks_[0].mem;
  remaining_ = first_blocks_[0].size;
  last_alloc_ = NULL;

  ARENASET(status_.bytes_allocated_ = block_size_);

  // We do not know for sure whether or not the first block is aligned,
  // so we fix that right now.
  const int overage = reinterpret_cast<uintptr_t>(freestart_) &
                      (kDefaultAlignment-1);
  if (overage > 0) {
    const int waste = kDefaultAlignment - overage;
    freestart_ += waste;
    remaining_ -= waste;
  }
  freestart_when_empty_ = freestart_;
  assert(!(reinterpret_cast<uintptr_t>(freestart_)&(kDefaultAlignment-1)));
}